

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model_dict.hpp
# Opt level: O1

Matrix * __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dict>::interaction_matrix
          (Matrix *__return_storage_ptr__,
          BinaryQuadraticModel<unsigned_int,_double,_cimod::Dict> *this)

{
  Quadratic<unsigned_int,_double> *this_00;
  key_type *__k;
  size_type sVar1;
  long lVar2;
  pointer puVar3;
  __node_base_ptr p_Var4;
  mapped_type *pmVar5;
  const_iterator cVar6;
  ulong uVar7;
  ulong uVar8;
  mapped_type mVar9;
  double dVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  key_type local_78;
  key_type local_70;
  undefined8 local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  long local_48;
  size_type local_40;
  ulong local_38;
  
  get_variables(&local_60,this);
  sVar1 = (this->m_linear)._M_h._M_element_count;
  local_78 = (key_type)(sVar1 + 1);
  local_68 = 0;
  local_70 = local_78;
  if ((long)local_78 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              *)&local_78);
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = &this->m_quadratic;
    local_48 = 0;
    uVar7 = 0;
    local_40 = sVar1;
    do {
      sVar1 = local_40;
      __k = local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start + uVar7;
      p_Var4 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)this,(ulong)*__k % (this->m_linear)._M_h._M_bucket_count,__k,
                          (ulong)*__k);
      mVar9 = 0.0;
      if ((p_Var4 != (__node_base_ptr)0x0) && (p_Var4->_M_nxt != (_Hash_node_base *)0x0)) {
        pmVar5 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)this,__k);
        mVar9 = *pmVar5;
      }
      if ((((long)sVar1 < 0) ||
          ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
           ).m_storage.m_rows <= (long)uVar7)) ||
         (lVar2 = (__return_storage_ptr__->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols
         , lVar2 <= (long)sVar1)) {
LAB_0015ffb4:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                     );
      }
      (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
      m_storage.m_data[lVar2 * uVar7 + sVar1] = mVar9;
      uVar8 = uVar7 + 1;
      local_38 = uVar8;
      if (uVar8 < (ulong)((long)local_60.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_60.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2)) {
        do {
          puVar3 = local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_78.second =
               local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
          local_78.first = *__k;
          cVar6 = std::
                  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&this_00->_M_h,&local_78);
          if (cVar6.
              super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_true>
              ._M_cur == (__node_type *)0x0) {
            dVar10 = 0.0;
          }
          else {
            local_78.second = puVar3[uVar8];
            local_78.first = *__k;
            cVar6 = std::
                    _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&this_00->_M_h,&local_78);
            if (cVar6.
                super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            dVar10 = *(double *)
                      ((long)cVar6.
                             super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_true>
                             ._M_cur + 0x10) + 0.0;
          }
          local_78.second = *__k;
          local_78.first = puVar3[uVar8];
          cVar6 = std::
                  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&this_00->_M_h,&local_78);
          if (cVar6.
              super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_true>
              ._M_cur != (__node_type *)0x0) {
            local_78.second = *__k;
            local_78.first = puVar3[uVar8];
            cVar6 = std::
                    _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&this_00->_M_h,&local_78);
            if (cVar6.
                super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            dVar10 = dVar10 + *(double *)
                               ((long)cVar6.
                                      super__Node_iterator_base<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_true>
                                      ._M_cur + 0x10);
          }
          if ((((long)uVar8 < 0) ||
              ((__return_storage_ptr__->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows <=
               (long)uVar7)) ||
             (lVar2 = (__return_storage_ptr__->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                      m_cols, lVar2 <= (long)uVar8)) goto LAB_0015ffb4;
          *(double *)
           ((long)(__return_storage_ptr__->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_data
           + uVar8 * 8 + lVar2 * local_48) = dVar10;
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)((long)local_60.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_60.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      local_48 = local_48 + 8;
      uVar7 = local_38;
    } while (local_38 <
             (ulong)((long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix interaction_matrix() const {
      // generate matrix
      auto indices = this->get_variables();
      size_t system_size = this->get_num_variables();
      Matrix _interaction_matrix = Matrix::Zero( system_size + 1, system_size + 1 );
      const Linear<IndexType, FloatType> &linear = m_linear;
      const Quadratic<IndexType, FloatType> &quadratic = m_quadratic;

      for ( size_t i = 0; i < indices.size(); i++ ) {
        const IndexType &i_index = indices[ i ];
        _interaction_matrix( i, system_size ) = ( linear.find( i_index ) != linear.end() ) ? linear.at( i_index ) : 0;
        for ( size_t j = i + 1; j < indices.size(); j++ ) {
          const IndexType &j_index = indices[ j ];
          FloatType jval = 0.0;

          if ( quadratic.find( std::make_pair( i_index, j_index ) ) != quadratic.end() ) {
            jval += quadratic.at( std::make_pair( i_index, j_index ) );
          }
          if ( quadratic.find( std::make_pair( j_index, i_index ) ) != quadratic.end() ) {
            jval += quadratic.at( std::make_pair( j_index, i_index ) );
          }

          _interaction_matrix( i, j ) = jval;
        }
      }

      return _interaction_matrix;
    }